

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O0

TrackInfo * __thiscall MIDISong2::FindNextDue(MIDISong2 *this)

{
  int iVar1;
  MIDISong2 *local_48;
  MIDISong2 *local_40;
  int local_28;
  uint local_24;
  int i;
  DWORD best;
  TrackInfo *track;
  MIDISong2 *this_local;
  
  if (((this->TrackDue->Finished & 1U) == 0) && (this->TrackDue->Delay == 0)) {
    this_local = (MIDISong2 *)this->TrackDue;
  }
  else {
    iVar1 = this->Format;
    if (iVar1 == 0) {
      if ((this->Tracks->Finished & 1U) == 0) {
        local_40 = (MIDISong2 *)this->Tracks;
      }
      else {
        local_40 = (MIDISong2 *)0x0;
      }
      this_local = local_40;
    }
    else if (iVar1 == 1) {
      _i = (MIDISong2 *)0x0;
      local_24 = 0xffffffff;
      for (local_28 = 0; local_28 < this->NumTracks; local_28 = local_28 + 1) {
        if (((this->Tracks[local_28].Finished & 1U) == 0) &&
           (this->Tracks[local_28].Delay < local_24)) {
          local_24 = this->Tracks[local_28].Delay;
          _i = (MIDISong2 *)(this->Tracks + local_28);
        }
      }
      this_local = _i;
    }
    else if (iVar1 == 2) {
      _i = (MIDISong2 *)this->TrackDue;
      if ((*(bool *)((_i->super_MIDIStreamer).Events[0] + 2) & 1U) != 0) {
        _i = (MIDISong2 *)((_i->super_MIDIStreamer).Events[0] + 10);
      }
      if (_i < (MIDISong2 *)(this->Tracks + this->NumTracks)) {
        local_48 = _i;
      }
      else {
        local_48 = (MIDISong2 *)0x0;
      }
      this_local = local_48;
    }
    else {
      this_local = (MIDISong2 *)0x0;
    }
  }
  return (TrackInfo *)this_local;
}

Assistant:

MIDISong2::TrackInfo *MIDISong2::FindNextDue ()
{
	TrackInfo *track;
	DWORD best;
	int i;

	// Give precedence to whichever track last had events taken from it.
	if (!TrackDue->Finished && TrackDue->Delay == 0)
	{
		return TrackDue;
	}

	switch (Format)
	{
	case 0:
		return Tracks[0].Finished ? NULL : Tracks;
		
	case 1:
		track = NULL;
		best = 0xFFFFFFFF;
		for (i = 0; i < NumTracks; ++i)
		{
			if (!Tracks[i].Finished)
			{
				if (Tracks[i].Delay < best)
				{
					best = Tracks[i].Delay;
					track = &Tracks[i];
				}
			}
		}
		return track;

	case 2:
		track = TrackDue;
		if (track->Finished)
		{
			track++;
		}
		return track < &Tracks[NumTracks] ? track : NULL;
	}
	return NULL;
}